

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O1

void __thiscall Gameplay::economyPhase(Gameplay *this)

{
  Gameplay *pGVar1;
  long *plVar2;
  Stronghold *this_00;
  string *psVar3;
  ostream *poVar4;
  DynastyDeck *this_01;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ECONOMY PHASE",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  ArrangeTurns(this);
  pGVar1 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar1;
  while (pGVar1 != this) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
    this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
    psVar3 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    this_01 = Player::getProvinces((Player *)((this->it)._M_node + 1));
    DynastyDeck::PrintCards(this_01);
    Player::buyCards((Player *)((this->it)._M_node + 1));
    pGVar1 = (Gameplay *)((this->it)._M_node)->_M_next;
    (this->it)._M_node = (_List_node_base *)pGVar1;
  }
  return;
}

Assistant:

void Gameplay::economyPhase()                                   //phase4: each player can buy black cards if he wants
{
    cout << "ECONOMY PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << it->getStronghold()->getName() << endl << endl;

        it->getProvinces().PrintCards();
        it->buyCards();
    }
}